

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

Statement *
slang::ast::RandSequenceStatement::fromSyntax
          (Compilation *comp,RandSequenceStatementSyntax *syntax,ASTContext *context)

{
  string_view name;
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  reference ppRVar4;
  RandSequenceStatement *pRVar5;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_02;
  BumpAllocator *extraout_RDX_03;
  long in_RSI;
  EVP_PKEY_CTX *in_RDI;
  SourceRange SVar6;
  SourceRange SVar7;
  SmallVector<const_slang::ast::Expression_*,_5UL> args;
  RandSeqProductionSymbol *firstProd;
  SourceRange firstProdRange;
  RandSeqProductionSymbol *prod;
  specific_symbol_iterator<slang::ast::RandSeqProductionSymbol> __end2;
  specific_symbol_iterator<slang::ast::RandSeqProductionSymbol> __begin2;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>,_(std::ranges::subrange_kind)0>
  *__range2;
  SmallVector<const_slang::ast::RandSeqProductionSymbol_*,_5UL> productions;
  undefined1 in_stack_0000039f;
  ASTContext *in_stack_000003a0;
  ArgumentListSyntax *in_stack_000003a8;
  string_view in_stack_000003b0;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> in_stack_000003c0;
  SourceRange in_stack_00000580;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_00000590;
  specific_symbol_iterator<slang::ast::RandSeqProductionSymbol> *in_stack_fffffffffffffd58;
  SmallVectorBase<const_slang::ast::RandSeqProductionSymbol_*> *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  Token *in_stack_fffffffffffffd80;
  BumpAllocator *this;
  SyntaxNode *in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffe08;
  RandSeqProductionSymbol *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  SyntaxNode local_168 [2];
  SourceRange local_128;
  SourceLocation local_118;
  SourceLocation local_110;
  SourceRange local_108;
  SourceRange local_f8;
  string_view local_e0;
  SourceRange local_d0;
  RandSeqProductionSymbol *local_c0;
  SourceRange local_b8;
  RandSeqProductionSymbol *local_a0;
  RandSeqProductionSymbol *local_98;
  Symbol *local_90;
  Symbol *local_88;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>,_(std::ranges::subrange_kind)0>
  local_70;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>,_(std::ranges::subrange_kind)0>
  *local_60;
  SmallVectorBase<const_slang::ast::RandSeqProductionSymbol_*> local_58 [2];
  long local_10;
  EVP_PKEY_CTX *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  SmallVector<const_slang::ast::RandSeqProductionSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::RandSeqProductionSymbol_*,_5UL> *)0x13ca7ac);
  not_null<const_slang::ast::Scope_*>::operator->((not_null<const_slang::ast::Scope_*> *)0x13ca7b9);
  local_70 = Scope::membersOfType<slang::ast::RandSeqProductionSymbol>
                       ((Scope *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  local_60 = &local_70;
  local_88 = (Symbol *)
             std::ranges::
             subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>,_(std::ranges::subrange_kind)0>
             ::begin(local_60);
  local_90 = (Symbol *)
             std::ranges::
             subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>,_(std::ranges::subrange_kind)0>
             ::end(local_60);
  while( true ) {
    uVar1 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>_>
                      ((self_type *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    if (((uVar1 ^ 0xff) & 1) == 0) break;
    in_stack_fffffffffffffe10 =
         iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>,_false>
         ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>,_false>
                      *)0x13ca89a);
    local_a0 = in_stack_fffffffffffffe10;
    local_98 = in_stack_fffffffffffffe10;
    SmallVectorBase<const_slang::ast::RandSeqProductionSymbol_*>::push_back
              (in_stack_fffffffffffffd60,(RandSeqProductionSymbol **)in_stack_fffffffffffffd58);
    iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>,_false>
    ::operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>_>
              ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>,_false>
                *)in_stack_fffffffffffffd60);
  }
  SourceRange::SourceRange((SourceRange *)in_stack_fffffffffffffd60);
  local_c0 = (RandSeqProductionSymbol *)0x0;
  uVar2 = parsing::Token::operator_cast_to_bool((Token *)0x13ca936);
  if ((bool)uVar2) {
    SVar6 = parsing::Token::range(in_stack_fffffffffffffd80);
    local_d0 = SVar6;
    local_b8 = SVar6;
    local_e0 = parsing::Token::valueText
                         ((Token *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    name._M_str._0_7_ = in_stack_fffffffffffffe18;
    name._M_len = (size_t)in_stack_fffffffffffffe10;
    name._M_str._7_1_ = uVar1;
    SVar7.endLoc._0_7_ = in_stack_fffffffffffffe08;
    SVar7.startLoc = SVar6.startLoc;
    SVar7.endLoc._7_1_ = uVar2;
    local_f8 = local_b8;
    local_c0 = RandSeqProductionSymbol::findProduction(name,SVar7,(ASTContext *)SVar6.endLoc);
    src = extraout_RDX;
  }
  else {
    bVar3 = SmallVectorBase<const_slang::ast::RandSeqProductionSymbol_*>::empty(local_58);
    src = extraout_RDX_00;
    if (!bVar3) {
      ppRVar4 = SmallVectorBase<const_slang::ast::RandSeqProductionSymbol_*>::operator[](local_58,0)
      ;
      local_c0 = *ppRVar4;
      local_110 = parsing::Token::location((Token *)(local_10 + 0x58));
      local_128 = parsing::Token::range(in_stack_fffffffffffffd80);
      local_118 = SourceRange::end(&local_128);
      SourceRange::SourceRange(&local_108,local_110,local_118);
      local_b8.startLoc = local_108.startLoc;
      local_b8.endLoc = local_108.endLoc;
      src = extraout_RDX_01;
    }
  }
  if (local_c0 != (RandSeqProductionSymbol *)0x0) {
    in_stack_fffffffffffffdb0 = local_168;
    SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
              ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x13cab66);
    CallExpression::bindArgs
              (in_stack_000003a8,in_stack_000003c0,in_stack_000003b0,in_stack_00000580,
               in_stack_000003a0,in_stack_00000590,(bool)in_stack_0000039f);
    SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
              ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x13cabff);
    src = extraout_RDX_02;
  }
  SmallVectorBase<const_slang::ast::RandSeqProductionSymbol_*>::copy(local_58,local_8,src);
  this = extraout_RDX_03;
  SVar7 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffdb0);
  pRVar5 = BumpAllocator::
           emplace<slang::ast::RandSequenceStatement,slang::ast::RandSeqProductionSymbol_const*&,std::span<slang::ast::RandSeqProductionSymbol_const*,18446744073709551615ul>,slang::SourceRange>
                     (this,(RandSeqProductionSymbol **)local_8,
                      (span<const_slang::ast::RandSeqProductionSymbol_*,_18446744073709551615UL> *)
                      SVar7.startLoc,(SourceRange *)SVar7.endLoc);
  SmallVector<const_slang::ast::RandSeqProductionSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::RandSeqProductionSymbol_*,_5UL> *)0x13cacd0);
  return &pRVar5->super_Statement;
}

Assistant:

Statement& RandSequenceStatement::fromSyntax(Compilation& comp,
                                             const RandSequenceStatementSyntax& syntax,
                                             const ASTContext& context) {
    SmallVector<const RandSeqProductionSymbol*> productions;
    for (auto& prod : context.scope->membersOfType<RandSeqProductionSymbol>())
        productions.push_back(&prod);

    SourceRange firstProdRange;
    const RandSeqProductionSymbol* firstProd = nullptr;
    if (syntax.firstProduction) {
        firstProdRange = syntax.firstProduction.range();
        firstProd = RandSeqProductionSymbol::findProduction(syntax.firstProduction.valueText(),
                                                            firstProdRange, context);
    }
    else if (!productions.empty()) {
        firstProd = productions[0];
        firstProdRange = {syntax.randsequence.location(), syntax.closeParen.range().end()};
    }

    if (firstProd) {
        // Make sure the first production doesn't require arguments.
        SmallVector<const Expression*> args;
        CallExpression::bindArgs(nullptr, firstProd->arguments, firstProd->name, firstProdRange,
                                 context, args, /* isBuiltInMethod */ false);
    }

    // All of the logic for creating productions is in the RandSeqProduction symbol.
    return *comp.emplace<RandSequenceStatement>(firstProd, productions.copy(comp),
                                                syntax.sourceRange());
}